

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O1

void Residu(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg)

{
  long lVar1;
  Word16 *pWVar2;
  Word16 WVar3;
  long lVar4;
  ushort uVar5;
  short *psVar6;
  uint uVar7;
  uint uVar8;
  
  lVar1 = 0;
  pWVar2 = x;
  do {
    uVar7 = (int)x[lVar1] << 0xc;
    lVar4 = -1;
    psVar6 = a + 1;
    do {
      uVar8 = (int)pWVar2[lVar4] * (int)*psVar6 + uVar7;
      if ((-1 < (int)((int)pWVar2[lVar4] * (int)*psVar6 ^ uVar7)) && ((int)(uVar8 ^ uVar7) < 0)) {
        st->Overflow = 1;
        uVar8 = 0x7fffffff - ((int)uVar7 >> 0x1f);
      }
      uVar7 = uVar8;
      lVar4 = lVar4 + -1;
      psVar6 = psVar6 + 1;
    } while (lVar4 != -0xb);
    uVar8 = uVar7 + 0x800;
    if ((int)(uVar7 ^ uVar8) < 0 && -1 < (int)uVar7) {
      st->Overflow = 1;
      uVar8 = 0x7fffffff;
    }
    uVar5 = 5;
    do {
      if (0x3fffffff < (int)uVar8) {
        st->Overflow = 1;
        WVar3 = 0x7fff;
        goto LAB_0010632f;
      }
      if ((int)uVar8 < -0x40000000) {
        st->Overflow = 1;
        WVar3 = -0x8000;
        goto LAB_0010632f;
      }
      uVar8 = uVar8 * 2;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
    WVar3 = (Word16)(uVar8 >> 0x10);
LAB_0010632f:
    y[lVar1] = WVar3;
    lVar1 = lVar1 + 1;
    pWVar2 = pWVar2 + 1;
    if (lVar1 == 0x3c) {
      return;
    }
  } while( true );
}

Assistant:

void Residu(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg)
{
  Word16 i, j;
  Word32 s;

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);
    for (j = 1; j <= TSC_pp; j++)
      s = L_mac0(st, s, a[j], x[i-j]);

    s = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    s = L_shl(st, s, (Word16)4);				/* Saturation */
    y[i] = extract_h(s);
  }
  return;
}